

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testWithTranslateRotateAndScale<float>(M44d *m)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Vec3 *pVVar4;
  float *pfVar5;
  ostream *poVar6;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar14;
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar18 [16];
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  Rand48 rand;
  vector<float,_std::allocator<float>_> weights;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  Vec3 *local_228;
  Vec3 *pVStack_220;
  long local_218;
  ushort local_206 [3];
  double local_200;
  vector<float,_std::allocator<float>_> local_1f8;
  double local_1d8;
  double dStack_1d0;
  float *local_1c8;
  undefined8 uStack_1c0;
  long local_1b8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  Vec3<float> local_138;
  undefined4 uStack_12c;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  float local_b8;
  undefined4 uStack_b4;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n",0x31);
  Imath_3_2::operator<<((ostream *)&std::cout,m);
  local_206[0] = 0xd35a;
  local_206[1] = 0xc826;
  local_206[2] = 0xd35a;
  local_218 = 0;
  local_228 = (Vec3 *)0x0;
  pVStack_220 = (Vec3 *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numPoints: ",0xb);
  std::ostream::flush();
  lVar8 = 1;
  do {
    local_200 = (double)Imath_3_2::erand48(local_206);
    local_1d8 = (double)Imath_3_2::erand48(local_206);
    dStack_1d0 = extraout_XMM0_Qb;
    dVar12 = (double)Imath_3_2::erand48(local_206);
    local_138.x = (float)local_200;
    local_138.y = (float)local_1d8;
    local_138.z = (float)dVar12;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_228,
               &local_138);
    dVar12 = (double)Imath_3_2::erand48(local_206);
    local_138.x = (float)dVar12;
    if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_1f8,
                 (iterator)
                 local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_138.x);
    }
    else {
      *local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_138.x;
      local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_1c8 = (float *)0x0;
    uStack_1c0 = 0;
    local_1b8 = 0;
    lVar9 = 8;
    uVar10 = 0;
    do {
      dVar21 = (double)*(float *)(local_228 + lVar9 + -8);
      dVar23 = (double)*(float *)(local_228 + lVar9 + -4);
      dVar13 = (double)*(float *)(local_228 + lVar9);
      dVar12 = m->x[2][3] * dVar13 + m->x[0][3] * dVar21 + m->x[1][3] * dVar23 + m->x[3][3];
      uVar26 = (undefined4)((ulong)dVar12 >> 0x20);
      fVar25 = (float)dVar12;
      local_138.z = (float)(m->x[2][2] * dVar13 + m->x[0][2] * dVar21 + m->x[1][2] * dVar23 +
                           m->x[3][2]) / fVar25;
      auVar15._0_4_ =
           (float)(dVar13 * m->x[2][0] + dVar21 * m->x[0][0] + m->x[1][0] * dVar23 + m->x[3][0]);
      auVar15._4_4_ =
           (float)(dVar13 * m->x[2][1] + dVar21 * m->x[0][1] + m->x[1][1] * dVar23 + m->x[3][1]);
      auVar15._8_8_ = 0;
      auVar16._4_4_ = fVar25;
      auVar16._0_4_ = fVar25;
      auVar16._8_4_ = uVar26;
      auVar16._12_4_ = uVar26;
      auVar16 = divps(auVar15,auVar16);
      local_138.x = auVar16._0_4_;
      local_138.y = auVar16._4_4_;
      std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
      emplace_back<Imath_3_2::Vec3<float>>
                ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_1c8
                 ,&local_138);
      uVar10 = uVar10 + 1;
      uVar7 = ((long)pVStack_220 - (long)local_228 >> 2) * -0x5555555555555555;
      lVar9 = lVar9 + 0xc;
    } while (uVar10 < uVar7);
    local_200 = (double)lVar8;
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_138,local_228,local_1c8,
               (ulong)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,SUB81(uVar7,0));
    pfVar5 = local_1c8;
    pVVar4 = local_228;
    lVar8 = ((long)pVStack_220 - (long)local_228 >> 2) * -0x5555555555555555;
    if (pVStack_220 != local_228) {
      dVar12 = (double)CONCAT44(local_138.y,local_138.x);
      dVar13 = (double)CONCAT44(uStack_12c,local_138.z);
      lVar9 = lVar8 + (ulong)(lVar8 == 0);
      lVar11 = 8;
      dVar21 = local_128;
      dVar23 = dStack_120;
      dVar27 = local_118;
      dVar28 = dStack_110;
      dVar29 = local_108;
      dVar30 = dStack_100;
      dVar31 = local_f8;
      dVar32 = dStack_f0;
      dVar33 = local_d8;
      dVar34 = dStack_d0;
      dVar35 = local_e8;
      dVar36 = dStack_e0;
      dVar37 = local_c8;
      dVar38 = dStack_c0;
      do {
        dVar22 = (double)*(float *)(pVVar4 + lVar11 + -8);
        dVar24 = (double)*(float *)(pVVar4 + lVar11 + -4);
        dVar14 = (double)*(float *)(pVVar4 + lVar11);
        fVar25 = (float)(dVar14 * dVar36 + dVar22 * dVar23 + dVar30 * dVar24 + dVar38);
        auVar17._0_4_ = (float)(dVar14 * dVar31 + dVar22 * dVar12 + dVar24 * dVar27 + dVar33);
        auVar17._4_4_ = (float)(dVar14 * dVar32 + dVar22 * dVar13 + dVar24 * dVar28 + dVar34);
        auVar17._8_8_ = 0;
        auVar2._4_4_ = fVar25;
        auVar2._0_4_ = fVar25;
        auVar2._8_4_ = fVar25;
        auVar2._12_4_ = fVar25;
        auVar16 = divps(auVar17,auVar2);
        uVar1 = *(undefined8 *)((long)pfVar5 + lVar11 + -8);
        fVar20 = (float)(dVar14 * dVar35 + dVar22 * dVar21 + dVar29 * dVar24 + dVar37) / fVar25 -
                 *(float *)((long)pfVar5 + lVar11);
        fVar25 = auVar16._0_4_ - (float)uVar1;
        fVar19 = auVar16._4_4_ - (float)((ulong)uVar1 >> 0x20);
        fVar25 = fVar20 * fVar20 + fVar25 * fVar25 + fVar19 * fVar19;
        if (fVar25 < 2.3509887e-38) {
          local_1d8 = dVar12;
          dStack_1d0 = dVar13;
          local_1a8 = dVar37;
          dStack_1a0 = dVar38;
          local_198 = dVar35;
          dStack_190 = dVar36;
          local_188 = dVar33;
          dStack_180 = dVar34;
          local_178 = dVar31;
          dStack_170 = dVar32;
          local_168 = dVar29;
          dStack_160 = dVar30;
          local_158 = dVar27;
          dStack_150 = dVar28;
          local_148 = dVar21;
          dStack_140 = dVar23;
          testWithTranslateRotateAndScale<float>();
          dVar12 = local_1d8;
          dVar13 = dStack_1d0;
          dVar21 = local_148;
          dVar23 = dStack_140;
          dVar27 = local_158;
          dVar28 = dStack_150;
          dVar29 = local_168;
          dVar30 = dStack_160;
          dVar31 = local_178;
          dVar32 = dStack_170;
          dVar33 = local_188;
          dVar34 = dStack_180;
          dVar35 = local_198;
          dVar36 = dStack_190;
          dVar37 = local_1a8;
          dVar38 = dStack_1a0;
          fVar25 = local_b8;
          if ((extraout_RAX & 1) == 0) goto LAB_0014b0f2;
        }
        else {
          fVar25 = SQRT(fVar25);
LAB_0014b0f2:
          if (0.0001 <= fVar25) {
            __assert_fail("(from[i] * res - to[i]).length () < eps",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                          ,0x62,
                          "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]"
                         );
          }
        }
        lVar11 = lVar11 + 0xc;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_b8,pVVar4,(ulong)pfVar5,SUB81(lVar8,0));
    pfVar5 = local_1c8;
    pVVar4 = local_228;
    dVar12 = (double)CONCAT44(uStack_b4,local_b8);
    local_138.z = SUB84(dStack_b0,0);
    uStack_12c = (undefined4)((ulong)dStack_b0 >> 0x20);
    local_118 = local_98;
    dStack_110 = dStack_90;
    local_f8 = local_78;
    dStack_f0 = dStack_70;
    local_d8 = local_58;
    dStack_d0 = dStack_50;
    local_128 = local_a8;
    dStack_120 = dStack_a0;
    local_108 = local_88;
    dStack_100 = dStack_80;
    local_e8 = local_68;
    dStack_e0 = dStack_60;
    local_c8 = local_48;
    dStack_c0 = dStack_40;
    if ((long)pVStack_220 - (long)local_228 == 0) {
      dVar12 = local_200;
      if (local_1c8 != (float *)0x0) goto LAB_0014b465;
    }
    else {
      lVar8 = ((long)pVStack_220 - (long)local_228 >> 2) * -0x5555555555555555;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      lVar9 = 8;
      dVar13 = dStack_b0;
      dVar21 = local_a8;
      dVar23 = dStack_a0;
      dVar27 = local_98;
      dVar28 = dStack_90;
      dVar29 = local_88;
      dVar30 = dStack_80;
      dVar31 = local_78;
      dVar32 = dStack_70;
      dVar33 = local_58;
      dVar34 = dStack_50;
      dVar35 = local_68;
      dVar36 = dStack_60;
      dVar37 = local_48;
      dVar38 = dStack_40;
      do {
        dVar22 = (double)*(float *)(pVVar4 + lVar9 + -8);
        dVar24 = (double)*(float *)(pVVar4 + lVar9 + -4);
        dVar14 = (double)*(float *)(pVVar4 + lVar9);
        fVar25 = (float)(dVar14 * dVar36 + dVar22 * dVar23 + dVar30 * dVar24 + dVar38);
        auVar18._0_4_ = (float)(dVar14 * dVar31 + dVar22 * dVar12 + dVar24 * dVar27 + dVar33);
        auVar18._4_4_ = (float)(dVar14 * dVar32 + dVar22 * dVar13 + dVar24 * dVar28 + dVar34);
        auVar18._8_8_ = 0;
        auVar3._4_4_ = fVar25;
        auVar3._0_4_ = fVar25;
        auVar3._8_4_ = fVar25;
        auVar3._12_4_ = fVar25;
        auVar16 = divps(auVar18,auVar3);
        uVar1 = *(undefined8 *)((long)pfVar5 + lVar9 + -8);
        fVar20 = (float)(dVar14 * dVar35 + dVar22 * dVar21 + dVar29 * dVar24 + dVar37) / fVar25 -
                 *(float *)((long)pfVar5 + lVar9);
        fVar25 = auVar16._0_4_ - (float)uVar1;
        fVar19 = auVar16._4_4_ - (float)((ulong)uVar1 >> 0x20);
        fVar25 = fVar20 * fVar20 + fVar25 * fVar25 + fVar19 * fVar19;
        if (fVar25 < 2.3509887e-38) {
          local_1d8 = dVar12;
          dStack_1d0 = dVar13;
          local_1a8 = dVar37;
          dStack_1a0 = dVar38;
          local_198 = dVar35;
          dStack_190 = dVar36;
          local_188 = dVar33;
          dStack_180 = dVar34;
          local_178 = dVar31;
          dStack_170 = dVar32;
          local_168 = dVar29;
          dStack_160 = dVar30;
          local_158 = dVar27;
          dStack_150 = dVar28;
          local_148 = dVar21;
          dStack_140 = dVar23;
          testWithTranslateRotateAndScale<float>();
          dVar12 = local_1d8;
          dVar13 = dStack_1d0;
          dVar21 = local_148;
          dVar23 = dStack_140;
          dVar27 = local_158;
          dVar28 = dStack_150;
          dVar29 = local_168;
          dVar30 = dStack_160;
          dVar31 = local_178;
          dVar32 = dStack_170;
          dVar33 = local_188;
          dVar34 = dStack_180;
          dVar35 = local_198;
          dVar36 = dStack_190;
          dVar37 = local_1a8;
          dVar38 = dStack_1a0;
          fVar25 = local_b8;
          if ((extraout_RAX_00 & 1) == 0) goto LAB_0014b37a;
        }
        else {
          fVar25 = SQRT(fVar25);
LAB_0014b37a:
          if (0.0001 <= fVar25) {
            __assert_fail("(from[i] * res - to[i]).length () < eps",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                          ,0x68,
                          "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]"
                         );
          }
        }
        lVar9 = lVar9 + 0xc;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
LAB_0014b465:
      dVar12 = local_200;
      operator_delete(pfVar5,local_1b8 - (long)pfVar5);
    }
    lVar8 = (long)dVar12 + 1;
    if (lVar8 == 10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_228 != (Vec3 *)0x0) {
        operator_delete(local_228,local_218 - (long)local_228);
      }
      return;
    }
  } while( true );
}

Assistant:

void
testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3>                           from;
    std::vector<T>                            weights;

    const float eps = 1e-4f;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf())));
        weights.push_back(static_cast<T>(rand.nextf()));
        std::cout << from.size () << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size (); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res =
            IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
                &from[0], &to[0], &weights[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
            &from[0], &to[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);
    }
    std::cout << "  OK\n";
}